

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O1

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::doNoteNonLinear
          (SimplifyLocals<true,_true,_true> *this,SimplifyLocals<true,_true,_true> *self,
          Expression **currp)

{
  _Rb_tree_header *p_Var1;
  BranchUtils BVar2;
  BranchUtils *this_00;
  Sinkables *pSVar3;
  _Base_ptr p_Var4;
  vector<wasm::SimplifyLocals<true,true,true>::BlockBreak,std::allocator<wasm::SimplifyLocals<true,true,true>::BlockBreak>>
  *this_01;
  undefined1 auStack_78 [8];
  Name target;
  NameSet targets;
  
  this_00 = (BranchUtils *)
            (self->
            super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
            ).super_Pass._vptr_Pass;
  BVar2 = *this_00;
  if (BVar2 != (BranchUtils)0x1) {
    if (BVar2 == (BranchUtils)0x2) {
      if (*(long *)(this_00 + 0x20) != 0) {
        __assert_fail("!curr->cast<If>() ->ifFalse",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x91,
                      "static void wasm::SimplifyLocals<>::doNoteNonLinear(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
                     );
      }
    }
    else if (BVar2 == (BranchUtils)0x4) {
      if (*(long *)(this_00 + 0x20) == 0) {
        this_01 = (vector<wasm::SimplifyLocals<true,true,true>::BlockBreak,std::allocator<wasm::SimplifyLocals<true,true,true>::BlockBreak>>
                   *)std::
                     map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_true,_true>::BlockBreak>_>_>_>_>
                     ::operator[](&this->blockBreaks,(key_type *)(this_00 + 0x10));
        targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &targets._M_t._M_impl.super__Rb_tree_header._M_header;
        targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          pSVar3 = (Sinkables *)&targets;
          targets._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               (ulong)(uint)targets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
          targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        else {
          p_Var1 = &(this->sinkables)._M_t._M_impl.super__Rb_tree_header;
          targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          p_Var4 = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          (targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
               targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pSVar3 = &this->sinkables;
          targets._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var1->_M_header;
          (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var1->_M_header;
          targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
        }
        (((_Rep_type *)&pSVar3->_M_t)->_M_impl).super__Rb_tree_header._M_node_count = 0;
        target.super_IString.str._M_str = (char *)self;
        std::
        vector<wasm::SimplifyLocals<true,true,true>::BlockBreak,std::allocator<wasm::SimplifyLocals<true,true,true>::BlockBreak>>
        ::emplace_back<wasm::SimplifyLocals<true,true,true>::BlockBreak>
                  (this_01,(BlockBreak *)&target.super_IString.str._M_str);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
                     *)&targets);
      }
      else {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)&this->unoptimizableBlocks,(Name *)(this_00 + 0x10));
      }
    }
    else {
      targets._M_t._M_impl._0_4_ = 0;
      targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      targets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Rb_tree_node_base *)&targets;
      targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Rb_tree_node_base *)&targets;
      BranchUtils::
      operateOnScopeNameUses<wasm::BranchUtils::getUniqueTargets(wasm::Expression*)::_lambda(wasm::Name&)_1_>
                (this_00,(Expression *)&target.super_IString.str._M_str,
                 (anon_class_8_1_ba1d7401)currp);
      if (targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Rb_tree_node_base *)&targets) {
        p_Var4 = targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          auStack_78 = *(undefined1 (*) [8])(p_Var4 + 1);
          target.super_IString.str._M_len = (size_t)p_Var4[1]._M_parent;
          std::
          _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
          ::_M_insert_unique<wasm::Name_const&>
                    ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                      *)&this->unoptimizableBlocks,(Name *)auStack_78);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != (_Rb_tree_node_base *)&targets);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&target.super_IString.str._M_str);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
    ::clear(&(this->sinkables)._M_t);
  }
  return;
}

Assistant:

static void
  doNoteNonLinear(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
                  Expression** currp) {
    // Main processing.
    auto* curr = *currp;
    if (auto* br = curr->dynCast<Break>()) {
      if (br->value) {
        // value means the block already has a return value
        self->unoptimizableBlocks.insert(br->name);
      } else {
        self->blockBreaks[br->name].push_back(
          {currp, std::move(self->sinkables)});
      }
    } else if (curr->is<Block>()) {
      return; // handled in visitBlock
    } else if (curr->is<If>()) {
      assert(!curr->cast<If>()
                ->ifFalse); // if-elses are handled by doNoteIf* methods
    } else {
      // Not one of the recognized instructions, so do not optimize here: mark
      // all the targets as unoptimizable.
      // TODO optimize BrOn, Switch, etc.
      auto targets = BranchUtils::getUniqueTargets(curr);
      for (auto target : targets) {
        self->unoptimizableBlocks.insert(target);
      }
      // TODO: we could use this info to stop gathering data on these blocks
    }
    self->sinkables.clear();
  }